

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::InvalidVSInputsTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,InvalidVSInputsTest *this,_test_iteration iteration)

{
  ostream *poVar1;
  TestError *this_00;
  char *local_3d8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  string local_390 [32];
  char *local_370;
  char *qualifier;
  stringstream body_sstream_1;
  ostream local_358;
  string local_1e0 [32];
  char *local_1c0;
  char *type;
  stringstream local_1a8 [8];
  stringstream body_sstream;
  ostream local_198;
  undefined1 local_1d;
  _test_iteration local_1c;
  InvalidVSInputsTest *pIStack_18;
  _test_iteration iteration_local;
  InvalidVSInputsTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = iteration;
  pIStack_18 = this;
  this_local = (InvalidVSInputsTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(local_1c) {
  case TEST_ITERATION_FIRST:
  case TEST_ITERATION_INVALID_BVEC2_INPUT:
  case TEST_ITERATION_INVALID_BVEC3_INPUT:
  case TEST_ITERATION_INVALID_BVEC4_INPUT:
    std::__cxx11::stringstream::stringstream(local_1a8);
    if (local_1c == TEST_ITERATION_FIRST) {
      local_3b0 = "bool";
    }
    else {
      if (local_1c == TEST_ITERATION_INVALID_BVEC2_INPUT) {
        local_3b8 = "bvec2";
      }
      else {
        if (local_1c == TEST_ITERATION_INVALID_BVEC3_INPUT) {
          local_3c0 = "mix_vec3_bvec3";
        }
        else {
          local_3c0 = "mix_vec4_bvec4";
        }
        local_3c0 = local_3c0 + 9;
        local_3b8 = local_3c0;
      }
      local_3b0 = local_3b8;
    }
    local_1c0 = local_3b0;
    poVar1 = std::operator<<(&local_198,"#version 140\n\nin ");
    poVar1 = std::operator<<(poVar1,local_1c0);
    std::operator<<(poVar1," data;\n\nvoid main()\n{\n}\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    break;
  case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
  case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
  case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
    std::__cxx11::stringstream::stringstream((stringstream *)&qualifier);
    if (local_1c == TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT) {
      local_3d8 = "centroid";
    }
    else {
      local_3d8 = "sample";
      if (local_1c == TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT) {
        local_3d8 = "patch";
      }
    }
    local_370 = local_3d8;
    poVar1 = std::operator<<(&local_358,"#version 140\n\n");
    poVar1 = std::operator<<(poVar1,local_370);
    std::operator<<(poVar1," in vec4 data;\n\nvoid main()\n{\n}\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_390);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::stringstream::~stringstream((stringstream *)&qualifier);
    break;
  case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "#version 140\n\nin sampler2D data;\n\nvoid main()\n{\n}\n");
    break;
  case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "#version 140\n\nin struct\n{\n    vec4 test;\n} data;\n\nvoid main()\n{\n}\n");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x56b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidVSInputsTest::getShaderBody(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_INVALID_BOOL_INPUT:
	case TEST_ITERATION_INVALID_BVEC2_INPUT:
	case TEST_ITERATION_INVALID_BVEC3_INPUT:
	case TEST_ITERATION_INVALID_BVEC4_INPUT:
	{
		std::stringstream body_sstream;
		const char*		  type = (iteration == TEST_ITERATION_INVALID_BOOL_INPUT) ?
							   "bool" :
							   (iteration == TEST_ITERATION_INVALID_BVEC2_INPUT) ?
							   "bvec2" :
							   (iteration == TEST_ITERATION_INVALID_BVEC3_INPUT) ? "bvec3" : "bvec4";

		body_sstream << "#version 140\n"
						"\n"
						"in "
					 << type << " data;\n"
								"\n"
								"void main()\n"
								"{\n"
								"}\n";

		result = body_sstream.str();
		break;
	}

	case TEST_ITERATION_INVALID_OPAQUE_TYPE_INPUT:
	{
		result = "#version 140\n"
				 "\n"
				 "in sampler2D data;\n"
				 "\n"
				 "void main()\n"
				 "{\n"
				 "}\n";

		break;
	}

	case TEST_ITERATION_INVALID_STRUCTURE_INPUT:
	{
		result = "#version 140\n"
				 "\n"
				 "in struct\n"
				 "{\n"
				 "    vec4 test;\n"
				 "} data;\n"
				 "\n"
				 "void main()\n"
				 "{\n"
				 "}\n";

		break;
	}

	case TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT:
	case TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT:
	case TEST_ITERATION_INVALID_SAMPLE_QUALIFIED_INPUT:
	{
		std::stringstream body_sstream;
		const char*		  qualifier = (iteration == TEST_ITERATION_INVALID_CENTROID_QUALIFIED_INPUT) ?
									"centroid" :
									(iteration == TEST_ITERATION_INVALID_PATCH_QUALIFIED_INPUT) ? "patch" : "sample";

		body_sstream << "#version 140\n"
						"\n"
					 << qualifier << " in vec4 data;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "}\n";

		result = body_sstream.str();
		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */

	return result;
}